

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O3

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::advance_head(Consume *this)

{
  UnmovableFastTestAllocator<256UL> *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uintptr_t uint_pointer;
  undefined8 *puVar4;
  uintptr_t uint_pointer_1;
  ulong uVar5;
  
  this_00 = *(UnmovableFastTestAllocator<256UL> **)this;
  puVar1 = *(undefined8 **)(this + 8);
  puVar2 = (undefined8 *)this_00[2].m_living_bytes.super___atomic_base<unsigned_long>._M_i;
  if (puVar2 == puVar1) {
    uVar3 = *(ulong *)(this + 0x10);
    this_00[2].m_living_bytes.super___atomic_base<unsigned_long>._M_i = uVar3 & 0xfffffffffffffff0;
    puVar4 = puVar1;
    if ((uVar3 & 4) != 0) {
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate
                (this_00,(void *)puVar2[2],puVar2[3],puVar2[4],0);
      puVar4 = *(undefined8 **)(this + 8);
    }
    uVar5 = uVar3 ^ (ulong)puVar4;
    if (((uVar3 & 0xf0) == 0) == uVar5 < 0x100) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
      puVar4 = *(undefined8 **)(this + 8);
    }
    if ((puVar4 == (undefined8 *)((ulong)puVar4 & 0xffffffffffffff00 | 0xc0)) == uVar5 < 0x100) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x11c);
      puVar4 = *(undefined8 **)(this + 8);
    }
    LOCK();
    *puVar4 = 0;
    UNLOCK();
    if (uVar5 < 0x100) {
      memset((void *)(*(long *)(this + 8) + 8),0,
             (uVar3 & 0xfffffffffffffff0) - (*(long *)(this + 8) + 8));
    }
    else {
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate_page_zeroed
                (*(UnmovableFastTestAllocator<256UL> **)this,*(void **)(this + 8));
    }
  }
  return puVar2 == puVar1;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }